

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O1

string * __thiscall
pbrt::SpectrumHandle::ToString_abi_cxx11_(string *__return_storage_ptr__,SpectrumHandle *this)

{
  ulong uVar1;
  short sVar2;
  PiecewiseLinearSpectrum *this_00;
  
  uVar1 = (this->
          super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
          ).bits;
  this_00 = (PiecewiseLinearSpectrum *)(uVar1 & 0xffffffffffff);
  if (this_00 == (PiecewiseLinearSpectrum *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"(nullptr)","")
    ;
  }
  else {
    sVar2 = (short)(uVar1 >> 0x30);
    if (uVar1 >> 0x32 == 0) {
      if (uVar1 >> 0x31 == 0) {
        ConstantSpectrum::ToString_abi_cxx11_(__return_storage_ptr__,(ConstantSpectrum *)this_00);
      }
      else if (sVar2 == 2) {
        DenselySampledSpectrum::ToString_abi_cxx11_
                  (__return_storage_ptr__,(DenselySampledSpectrum *)this_00);
      }
      else {
        PiecewiseLinearSpectrum::ToString_abi_cxx11_(__return_storage_ptr__,this_00);
      }
    }
    else if (uVar1 >> 0x30 == 5) {
      RGBReflectanceSpectrum::ToString_abi_cxx11_
                (__return_storage_ptr__,(RGBReflectanceSpectrum *)this_00);
    }
    else if (sVar2 == 4) {
      RGBSpectrum::ToString_abi_cxx11_(__return_storage_ptr__,(RGBSpectrum *)this_00);
    }
    else {
      BlackbodySpectrum::ToString_abi_cxx11_(__return_storage_ptr__,(BlackbodySpectrum *)this_00);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SpectrumHandle::ToString() const {
    if (!ptr())
        return "(nullptr)";

    auto tostr = [&](auto ptr) { return ptr->ToString(); };
    return DispatchCPU(tostr);
}